

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,Mat *reference_blob,int *_woffset,int *_hoffset,int *_doffset
          ,int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int local_60;
  int local_5c;
  int ref_dims;
  int ref_channels;
  int ref_d;
  int ref_h;
  int ref_w;
  int dims;
  int channels;
  int *_doffset_local;
  int *_hoffset_local;
  int *_woffset_local;
  Mat *reference_blob_local;
  Mat *bottom_blob_local;
  Crop *this_local;
  
  local_60 = bottom_blob->c;
  iVar1 = bottom_blob->dims;
  iVar2 = reference_blob->w;
  iVar3 = reference_blob->h;
  iVar4 = reference_blob->d;
  iVar5 = reference_blob->c;
  iVar6 = reference_blob->dims;
  if (iVar1 == 1) {
    *_woffset = this->woffset;
    *_outw = iVar2;
  }
  if (iVar1 == 2) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_outw = iVar2;
    *_outh = iVar3;
  }
  if (iVar1 == 3) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_coffset = this->coffset;
    *_outw = iVar2;
    *_outh = iVar3;
    local_5c = local_60;
    if (iVar6 == 3) {
      local_5c = iVar5;
    }
    *_outc = local_5c;
  }
  if (iVar1 == 4) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_doffset = this->doffset;
    *_coffset = this->coffset;
    *_outw = iVar2;
    *_outh = iVar3;
    *_outd = iVar4;
    if (iVar6 == 4) {
      local_60 = iVar5;
    }
    *_outc = local_60;
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const Mat& reference_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    int ref_w = reference_blob.w;
    int ref_h = reference_blob.h;
    int ref_d = reference_blob.d;
    int ref_channels = reference_blob.c;
    int ref_dims = reference_blob.dims;

    if (dims == 1)
    {
        _woffset = woffset;
        _outw = ref_w;
    }
    if (dims == 2)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _outw = ref_w;
        _outh = ref_h;
    }
    if (dims == 3)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _coffset = coffset;
        _outw = ref_w;
        _outh = ref_h;
        _outc = ref_dims == 3 ? ref_channels : channels;
    }
    if (dims == 4)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = ref_w;
        _outh = ref_h;
        _outd = ref_d;
        _outc = ref_dims == 4 ? ref_channels : channels;
    }
}